

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::reset(CmdLine *this)

{
  bool bVar1;
  reference ppAVar2;
  _Self local_20;
  _Self local_18;
  ArgListIterator it;
  CmdLine *this_local;
  
  it._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(&this->_argList);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(&this->_argList);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppAVar2 = std::_List_iterator<TCLAP::Arg_*>::operator*(&local_18);
    (*(*ppAVar2)->_vptr_Arg[0xd])();
    std::_List_iterator<TCLAP::Arg_*>::operator++(&local_18,0);
  }
  std::__cxx11::string::clear();
  return;
}

Assistant:

inline void CmdLine::reset()
{
	for( ArgListIterator it = _argList.begin(); it != _argList.end(); it++ )
		(*it)->reset();
	
	_progName.clear();
}